

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_encode_url(char *inpath,int maxlength,char *outpath,int *status)

{
  int *in_RCX;
  byte *in_RDX;
  int in_ESI;
  byte *in_RDI;
  uchar isAcceptable [96];
  int iout;
  char *hex;
  char *q;
  char *p;
  uchar a;
  char acStackY_d8 [8];
  int local_4c;
  char *local_48;
  byte *local_40;
  byte *local_38;
  byte local_29;
  int *local_28;
  byte *local_20;
  int local_14;
  byte *local_10;
  
  local_48 = "0123456789ABCDEF";
  local_4c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memcpy(&stack0xffffffffffffff48,&DAT_00301750,0x60);
  if (*local_28 != 0) {
    return *local_28;
  }
  local_40 = local_20;
  for (local_38 = local_10; *local_38 != 0 && local_4c < local_14 + -1; local_38 = local_38 + 1) {
    local_29 = *local_38;
    if (((local_29 < 0x20) || (0x7f < local_29)) ||
       ((&stack0xffffffffffffff48)[(int)(local_29 - 0x20)] == '\0')) {
      if (local_14 + -1 <= local_4c + 2) {
        ffpmsg((char *)0x1f0138);
        *local_28 = 0x7d;
        *local_20 = 0;
        return *local_28;
      }
      *local_40 = 0x25;
      local_40[1] = local_48[(int)(uint)local_29 >> 4];
      local_40[2] = local_48[(int)(local_29 & 0xf)];
      local_4c = local_4c + 3;
      local_40 = local_40 + 3;
    }
    else {
      *local_40 = *local_38;
      local_4c = local_4c + 1;
      local_40 = local_40 + 1;
    }
  }
  if ((*local_38 != 0) && (local_4c == local_14 + -1)) {
    ffpmsg((char *)0x1f01e0);
    *local_28 = 0x7d;
    *local_20 = 0;
    return *local_28;
  }
  *local_40 = 0;
  return *local_28;
}

Assistant:

int fits_encode_url(char *inpath,  /* I URL  to be encoded                  */
                    int maxlength, /* I max number of chars that may be copied
                               to outpath, including terminating NULL. */ 
		    char *outpath, /* O output encoded URL                  */
		    int *status)
     /*
       encode all URL "unsafe" and "reserved" characters using the "%XX"
       convention, where XX stand for the two hexidecimal digits of the
       encode character's ASCII code.

       Note that the outpath length, as specified by the maxlength argument,
       should be at least as large as inpath and preferably larger (to hold
       any characters that need encoding).  If more than maxlength chars are 
       required for outpath, including the terminating NULL, outpath will
       be set to size 0 and an error status will be returned.
       
       This function was adopted from code in the libwww.a library available
       via the W3 consortium <URL: http://www.w3.org>
     */
{
  unsigned char a;
  
  char *p;
  char *q;
  char *hex = "0123456789ABCDEF";
  int iout=0;
  
unsigned const char isAcceptable[96] =
{/* 0x0 0x1 0x2 0x3 0x4 0x5 0x6 0x7 0x8 0x9 0xA 0xB 0xC 0xD 0xE 0xF */
  
    0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0xF,0xE,0x0,0xF,0xF,0xC, 
                                           /* 2x  !"#$%&'()*+,-./   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x8,0x0,0x0,0x0,0x0,0x0,
                                           /* 3x 0123456789:;<=>?   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF, 
                                           /* 4x @ABCDEFGHIJKLMNO   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x0,0x0,0x0,0x0,0xF,
                                           /* 5X PQRSTUVWXYZ[\]^_   */
    0x0,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,
                                           /* 6x `abcdefghijklmno   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x0,0x0,0x0,0x0,0x0  
                                           /* 7X pqrstuvwxyz{\}~DEL */
};

  if(*status != 0) return(*status);
  
  /* loop over all characters in inpath until '\0' is encountered */

  for(q = outpath, p = inpath; *p && (iout < maxlength-1) ; p++)
    {
      a = (unsigned char)*p;

      /* if the charcter requires encoding then process it */

      if(!( a>=32 && a<128 && (isAcceptable[a-32])))
	{
           if (iout+2 < maxlength-1)
           {
	     /* add a '%' character to the outpath */
	     *q++ = HEX_ESCAPE;
	     /* add the most significant ASCII code hex value */
	     *q++ = hex[a >> 4];
	     /* add the least significant ASCII code hex value */
	     *q++ = hex[a & 15];
             iout += 3;
           }
           else
           {
              ffpmsg("URL input is too long to encode (fits_encode_url)");
              *status = URL_PARSE_ERROR;
              outpath[0] = 0;
              return (*status);
           }
	}
      /* else just copy the character as is */
      else 
      {
         *q++ = *p;
         iout++;
      }
    }

  /* null terminate the outpath string */

  if (*p && (iout == maxlength-1))
  {
     ffpmsg("URL input is too long to encode (fits_encode_url)");
     *status = URL_PARSE_ERROR;
     outpath[0] = 0;
     return (*status);
  }
  *q++ = 0; 
  
  return(*status);
}